

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gd_io.c
# Opt level: O0

int gdGetByte(int *result,gdIOCtx *ctx)

{
  int iVar1;
  int r;
  gdIOCtx *ctx_local;
  int *result_local;
  
  iVar1 = (*ctx->getC)(ctx);
  if (iVar1 != -1) {
    *result = iVar1;
  }
  result_local._4_4_ = (uint)(iVar1 != -1);
  return result_local._4_4_;
}

Assistant:

int gdGetByte(int *result, gdIOCtx *ctx)
{
	int r;

	r = (ctx->getC)(ctx);
	if(r == EOF) {
		return 0;
	}

	*result = r;

	return 1;
}